

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O1

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::CreateRawPegoutTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          uint32_t version,uint32_t locktime,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
          *txouts,TxOutPegoutParameters *pegout_data,ConfidentialTxOut *txout_fee,
          Address *pegout_address)

{
  void *pvVar1;
  bool bVar2;
  Amount AVar3;
  undefined1 local_5e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  undefined1 local_5c0 [16];
  pointer local_5b0;
  ByteData local_5a8;
  Address dummy_addr;
  ConfidentialTxOut empty_fee;
  ConfidentialTxOutReference local_318;
  ConfidentialTxOutReference local_220;
  ConfidentialTxOutReference local_128;
  
  core::ConfidentialTxOut::ConfidentialTxOut(&empty_fee);
  CreateRawTransaction(__return_storage_ptr__,this,version,locktime,txins,txouts,&empty_fee);
  bVar2 = core::Pubkey::IsValid(&pegout_data->online_pubkey);
  if (bVar2) {
    bVar2 = core::Privkey::IsInvalid((Privkey *)&pegout_data->master_online_key);
    if (!bVar2) {
      core::Address::Address(&dummy_addr);
      ConfidentialTransactionController::AddPegoutTxOut
                (&local_128,__return_storage_ptr__,&pegout_data->amount,&pegout_data->asset,
                 &pegout_data->genesisblock_hash,&dummy_addr,pegout_data->net_type,
                 &pegout_data->online_pubkey,(Privkey *)&pegout_data->master_online_key,
                 &pegout_data->bitcoin_descriptor,pegout_data->bip32_counter,&pegout_data->whitelist
                 ,pegout_data->elements_net_type,pegout_address);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_128);
      core::Address::~Address(&dummy_addr);
      goto LAB_00403e40;
    }
  }
  core::Pubkey::Pubkey((Pubkey *)local_5c0);
  core::Privkey::Privkey((Privkey *)&dummy_addr);
  local_5e8._0_8_ = &local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"");
  core::ByteData::ByteData(&local_5a8);
  ConfidentialTransactionController::AddPegoutTxOut
            (&local_220,__return_storage_ptr__,&pegout_data->amount,&pegout_data->asset,
             &pegout_data->genesisblock_hash,&pegout_data->btc_address,kMainnet,(Pubkey *)local_5c0,
             (Privkey *)&dummy_addr,(string *)local_5e8,0,&local_5a8,kLiquidV1,(Address *)0x0);
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_220);
  if (local_5a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5a8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5a8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._0_8_ != &local_5d8) {
    operator_delete((void *)local_5e8._0_8_,local_5d8._M_allocated_capacity + 1);
  }
  if (dummy_addr._0_8_ != 0) {
    operator_delete((void *)dummy_addr._0_8_,
                    (long)dummy_addr.address_._M_dataplus._M_p - dummy_addr._0_8_);
  }
  if ((pointer)local_5c0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_5c0._0_8_,(long)local_5b0 - local_5c0._0_8_);
  }
LAB_00403e40:
  core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&dummy_addr,&txout_fee->confidential_value_);
  AVar3 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&dummy_addr);
  local_5e8._0_8_ = AVar3.amount_;
  local_5e8[8] = AVar3.ignore_check_;
  bVar2 = core::Amount::operator!=((Amount *)local_5e8,0);
  dummy_addr._0_8_ = &PTR__ConfidentialValue_0087cda8;
  if (dummy_addr._8_8_ != 0) {
    operator_delete((void *)dummy_addr._8_8_,dummy_addr.address_._M_string_length - dummy_addr._8_8_
                   );
  }
  if (bVar2) {
    core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&dummy_addr,&txout_fee->confidential_value_);
    AVar3 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&dummy_addr);
    local_5c0._0_8_ = AVar3.amount_;
    local_5c0[8] = AVar3.ignore_check_;
    core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)local_5e8,&txout_fee->asset_);
    ConfidentialTransactionController::AddTxOutFee
              (&local_318,__return_storage_ptr__,(Amount *)local_5c0,
               (ConfidentialAssetId *)local_5e8);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_318);
    local_5e8._0_8_ = &PTR__ConfidentialAssetId_0087ccc8;
    pvVar1 = (void *)CONCAT71(local_5e8._9_7_,local_5e8[8]);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,local_5d8._8_8_ - (long)pvVar1);
    }
    dummy_addr._0_8_ = &PTR__ConfidentialValue_0087cda8;
    if (dummy_addr._8_8_ != 0) {
      operator_delete((void *)dummy_addr._8_8_,
                      dummy_addr.address_._M_string_length - dummy_addr._8_8_);
    }
  }
  core::ConfidentialTxOut::~ConfidentialTxOut(&empty_fee);
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController
ElementsTransactionApi::CreateRawPegoutTransaction(
    uint32_t version, uint32_t locktime,
    const std::vector<ConfidentialTxIn>& txins,
    const std::vector<ConfidentialTxOut>& txouts,
    const TxOutPegoutParameters& pegout_data,
    const ConfidentialTxOut& txout_fee, Address* pegout_address) const {
  ConfidentialTxOut empty_fee;
  ConfidentialTransactionController ctxc =
      CreateRawTransaction(version, locktime, txins, txouts, empty_fee);

  if (pegout_data.online_pubkey.IsValid() &&
      !pegout_data.master_online_key.IsInvalid()) {
    Address dummy_addr;
    ctxc.AddPegoutTxOut(
        pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
        dummy_addr, pegout_data.net_type, pegout_data.online_pubkey,
        pegout_data.master_online_key, pegout_data.bitcoin_descriptor,
        pegout_data.bip32_counter, pegout_data.whitelist,
        pegout_data.elements_net_type, pegout_address);
  } else {
    ctxc.AddPegoutTxOut(
        pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
        pegout_data.btc_address);
  }

  // A fee with an amount of 0 is considered invalid.
  if (txout_fee.GetConfidentialValue().GetAmount() != 0) {
    ctxc.AddTxOutFee(
        txout_fee.GetConfidentialValue().GetAmount(), txout_fee.GetAsset());
  }

  return ctxc;
}